

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void addPaddingBits(uchar *out,uchar *in,size_t olinebits,size_t ilinebits,uint h)

{
  ulong uVar1;
  byte bVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t sVar8;
  
  if (h != 0) {
    uVar3 = 0;
    uVar4 = 0;
    uVar6 = 0;
    do {
      if (ilinebits != 0) {
        uVar1 = uVar6 + ilinebits;
        uVar5 = uVar4;
        sVar8 = ilinebits;
        do {
          bVar2 = '\x01' << (~(byte)uVar6 & 7);
          if ((in[uVar5 >> 3] >> (~(byte)uVar5 & 7) & 1) == 0) {
            out[uVar6 >> 3] = out[uVar6 >> 3] & ~bVar2;
          }
          else {
            out[uVar6 >> 3] = out[uVar6 >> 3] | bVar2;
          }
          uVar6 = uVar6 + 1;
          uVar5 = uVar5 + 1;
          sVar8 = sVar8 - 1;
        } while (sVar8 != 0);
        uVar4 = uVar4 + ilinebits;
        uVar6 = uVar1;
      }
      lVar7 = olinebits - ilinebits;
      if (olinebits != ilinebits) {
        do {
          bVar2 = ~(byte)uVar6 & 7;
          out[uVar6 >> 3] = out[uVar6 >> 3] & (-2 << bVar2 | 0xfeU >> 8 - bVar2);
          uVar6 = uVar6 + 1;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != h);
  }
  return;
}

Assistant:

static void addPaddingBits(unsigned char* out, const unsigned char* in,
                           size_t olinebits, size_t ilinebits, unsigned h)
{
  /*The opposite of the removePaddingBits function
  olinebits must be >= ilinebits*/
  unsigned y;
  size_t diff = olinebits - ilinebits;
  size_t obp = 0, ibp = 0; /*bit pointers*/
  for(y = 0; y != h; ++y)
  {
    size_t x;
    for(x = 0; x < ilinebits; ++x)
    {
      unsigned char bit = readBitFromReversedStream(&ibp, in);
      setBitOfReversedStream(&obp, out, bit);
    }
    /*obp += diff; --> no, fill in some value in the padding bits too, to avoid
    "Use of uninitialised value of size ###" warning from valgrind*/
    for(x = 0; x != diff; ++x) setBitOfReversedStream(&obp, out, 0);
  }
}